

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

void __thiscall
pbrt::SPPMIntegrator::SPPMIntegrator
          (SPPMIntegrator *this,CameraHandle *camera,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int nIterations,
          int photonsPerIteration,int maxDepth,Float initialSearchRadius,bool regularize,int seed,
          RGBColorSpace *colorSpace)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_50;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_38;
  
  local_38.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_50,lights);
  Integrator::Integrator(&this->super_Integrator,(PrimitiveHandle *)&local_38,&local_50);
  if (local_50.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Integrator)._vptr_Integrator = (_func_int **)&PTR__Integrator_031e5cb0;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = 0;
  uVar3 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = uVar3;
  this->initialSearchRadius = initialSearchRadius;
  this->digitPermutationsSeed = seed;
  this->nIterations = nIterations;
  this->regularize = regularize;
  this->maxDepth = maxDepth;
  if (photonsPerIteration < 1) {
    uVar3 = *(ulong *)((uVar3 & 0xffffffffffff) + 0x340) & 0xffffffffffff;
    uVar1 = *(undefined8 *)(uVar3 + 8);
    uVar2 = *(undefined8 *)(uVar3 + 0x10);
    photonsPerIteration =
         ((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) * ((int)uVar2 - (int)uVar1);
  }
  this->photonsPerIteration = photonsPerIteration;
  this->colorSpace = colorSpace;
  return;
}

Assistant:

SPPMIntegrator(CameraHandle camera, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int nIterations,
                   int photonsPerIteration, int maxDepth, Float initialSearchRadius,
                   bool regularize, int seed, const RGBColorSpace *colorSpace)
        : Integrator(aggregate, lights),
          camera(camera),
          initialSearchRadius(initialSearchRadius),
          nIterations(nIterations),
          maxDepth(maxDepth),
          photonsPerIteration(photonsPerIteration > 0
                                  ? photonsPerIteration
                                  : camera.GetFilm().PixelBounds().Area()),
          regularize(regularize),
          colorSpace(colorSpace),
          digitPermutationsSeed(seed) {}